

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# snedecor_f_dist.hpp
# Opt level: O0

result_type_conflict2 __thiscall
trng::snedecor_f_dist<double>::pdf(snedecor_f_dist<double> *this,result_type_conflict2 x)

{
  int iVar1;
  int extraout_EAX;
  char *in_RCX;
  int extraout_EDX;
  void *in_RSI;
  param_type *in_RDI;
  int in_R8D;
  int in_R9D;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  result_type_conflict2 m;
  result_type_conflict2 n;
  
  iVar1 = param_type::n(in_RDI);
  dVar2 = (double)iVar1;
  param_type::m(in_RDI,in_RSI,extraout_EDX,in_RCX,in_R8D,in_R9D);
  dVar3 = math::ln(1.72542496090574e-317);
  dVar4 = math::ln(1.72544669979416e-317);
  dVar5 = math::ln(1.72549511822745e-317);
  dVar6 = math::ln_Gamma(1.72554353666074e-317);
  dVar7 = math::ln_Gamma(1.72556231115528e-317);
  dVar8 = math::ln_Gamma(1.72558602630628e-317);
  dVar2 = exp((((-dVar5 * (dVar2 * 0.5 + (double)extraout_EAX * 0.5) +
                dVar3 * 0.5 * dVar2 + dVar4 * (dVar2 * 0.5 + -1.0)) - dVar6) - dVar7) + dVar8);
  return dVar2;
}

Assistant:

pdf(result_type x) const {
      const result_type n{static_cast<result_type>(P.n())};
      const result_type m{static_cast<result_type>(P.m())};
      // return math::exp(math::ln(n)*result_type(1)/result_type(2)*n +
      // math::ln(m)*result_type(1)/result_type(2)*m -
      // 		       math::ln(m+n*x)*result_type(1)/result_type(2)*(m+n) +
      // 		       math::ln(x)*(result_type(1)/result_type(2)*n-1))/math::Beta(result_type(1)/result_type(2)*n,
      // result_type(1)/result_type(2)*m);
      return math::exp(result_type(1) / result_type(2) * math::ln(n / m) * n +
                       math::ln(x) * (result_type(1) / result_type(2) * n - 1) -
                       math::ln(1 + n * x / m) * (result_type(1) / result_type(2) * n +
                                                  result_type(1) / result_type(2) * m) -
                       math::ln_Gamma(result_type(1) / result_type(2) * n) -
                       math::ln_Gamma(result_type(1) / result_type(2) * m) +
                       math::ln_Gamma(result_type(1) / result_type(2) * (n + m)));
    }